

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::setQPDFOptions(QPDFJob *this,QPDF *pdf)

{
  element_type *peVar1;
  shared_ptr<QPDFLogger> local_20;
  
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  QPDF::setLogger(pdf,&local_20);
  if (local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      ignore_xref_streams == true) {
    QPDF::setIgnoreXRefStreams(pdf,true);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      suppress_recovery == true) {
    QPDF::setAttemptRecovery(pdf,false);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      password_is_hex_key == true) {
    QPDF::setPasswordIsHexKey(pdf,true);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      suppress_warnings == true) {
    QPDF::setSuppressWarnings(pdf,true);
  }
  return;
}

Assistant:

void
QPDFJob::setQPDFOptions(QPDF& pdf)
{
    pdf.setLogger(m->log);
    if (m->ignore_xref_streams) {
        pdf.setIgnoreXRefStreams(true);
    }
    if (m->suppress_recovery) {
        pdf.setAttemptRecovery(false);
    }
    if (m->password_is_hex_key) {
        pdf.setPasswordIsHexKey(true);
    }
    if (m->suppress_warnings) {
        pdf.setSuppressWarnings(true);
    }
}